

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O2

void __thiscall adios2::profiling::JSONProfiler::JSONProfiler(JSONProfiler *this,Comm *comm)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *puVar1;
  int iVar2;
  allocator local_39;
  string local_38;
  
  IOChrono::IOChrono(&this->m_Profiler);
  this->m_RankMPI = 0;
  this->m_Comm = comm;
  (this->m_Profiler).m_IsActive = true;
  std::__cxx11::string::string((string *)&local_38,"buffering",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"PP",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_meta1_gather",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_meta2_gather",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_write_metadata",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"MetadataBlockWrite",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_AGG1",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_GatherMetadataBlocks",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_simple_meta",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_simple_gather",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_meta1",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_meta2",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_aggregate_info",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_gather_write_meta",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"FixedMetaInfoGather",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"MetaInfoBcast",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"SelectMetaInfoGather",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_close",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"ES_AWD",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"WaitOnAsync",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"BS_WaitOnAsync",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"DC_WaitOnAsync1",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"DC_WaitOnAsync2",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"PDW",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"DeriveVars",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  puVar1 = &(this->m_Profiler).m_Bytes;
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[10],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"buffering",&local_38);
  std::__cxx11::string::string((string *)&local_38,"DataRead",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[9],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"dataread",&local_38);
  std::__cxx11::string::string((string *)&local_38,"MetaDataRead",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[13],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"metadataread",&local_38);
  std::__cxx11::string::string((string *)&local_38,"MetaMetaDataRead",&local_39);
  AddTimerWatch(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[17],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"metadmetaataread",&local_38);
  iVar2 = helper::Comm::Rank(this->m_Comm);
  this->m_RankMPI = iVar2;
  return;
}

Assistant:

JSONProfiler::JSONProfiler(helper::Comm const &comm) : m_Comm(comm)
{
    m_Profiler.m_IsActive = true; // default is true

    AddTimerWatch("buffering");
    AddTimerWatch("ES");
    AddTimerWatch("PP");
    AddTimerWatch("ES_meta1_gather", false);
    AddTimerWatch("ES_meta2_gather", false);
    AddTimerWatch("ES_write_metadata", false);
    AddTimerWatch("MetadataBlockWrite", false);
    AddTimerWatch("ES_AGG1", false);
    AddTimerWatch("ES_GatherMetadataBlocks", false);
    AddTimerWatch("ES_simple_meta", false);
    AddTimerWatch("ES_simple_gather", false);

    AddTimerWatch("ES_meta1");
    AddTimerWatch("ES_meta2");

    AddTimerWatch("ES_aggregate_info", false);
    AddTimerWatch("ES_gather_write_meta", false);
    AddTimerWatch("FixedMetaInfoGather", false);
    AddTimerWatch("MetaInfoBcast", false);
    AddTimerWatch("SelectMetaInfoGather", false);

    AddTimerWatch("ES_close");
    AddTimerWatch("ES_AWD");
    AddTimerWatch("WaitOnAsync");
    AddTimerWatch("BS_WaitOnAsync");
    AddTimerWatch("DC_WaitOnAsync1");
    AddTimerWatch("DC_WaitOnAsync2");
    AddTimerWatch("PDW");

    AddTimerWatch("DeriveVars");

    m_Profiler.m_Bytes.emplace("buffering", 0);
    AddTimerWatch("DataRead");
    m_Profiler.m_Bytes.emplace("dataread", 0);
    AddTimerWatch("MetaDataRead");
    m_Profiler.m_Bytes.emplace("metadataread", 0);
    AddTimerWatch("MetaMetaDataRead");
    m_Profiler.m_Bytes.emplace("metadmetaataread", 0);

    m_RankMPI = m_Comm.Rank();
}